

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_planesurface.cpp
# Opt level: O2

void __thiscall ON_ClippingPlane::SetDepth(ON_ClippingPlane *this,double depth)

{
  bool bVar1;
  ON_ClippingPlaneData *pOVar2;
  ON_ClippingPlaneDataStore *dataStore;
  bool in_SIL;
  
  if (0.0 <= depth) {
    dataStore = &this->m_data_store;
    if ((depth != 0.0) || (NAN(depth))) {
      pOVar2 = GetClippingPlaneData(dataStore,in_SIL);
      if (pOVar2 != (ON_ClippingPlaneData *)0x0) {
        pOVar2->m_depth = depth;
      }
    }
    else {
      pOVar2 = GetClippingPlaneData(dataStore->m_sn);
      if (pOVar2 != (ON_ClippingPlaneData *)0x0) {
        pOVar2->m_depth = depth;
        bVar1 = ON_ClippingPlaneData::HasDefaultContent(pOVar2);
        if (bVar1) {
          DeleteClippingPlaneData(dataStore);
          return;
        }
      }
    }
  }
  return;
}

Assistant:

void ON_ClippingPlane::SetDepth(double depth)
{
  if (depth < 0.0)
    return;
  
  if (0.0 == depth)
  {
    ON_ClippingPlaneData* data = GetClippingPlaneData(m_data_store.m_sn);
    if (data)
    {
      data->m_depth = depth;
      if (data->HasDefaultContent())
      {
        DeleteClippingPlaneData(m_data_store);
      }
    }
    return;
  }
  
  ON_ClippingPlaneData* data = GetClippingPlaneData(m_data_store, true);
  if (data)
    data->m_depth = depth;
}